

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::PartialResponseService::request
          (PartialResponseService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  undefined4 in_register_00000034;
  Type local_40;
  HttpHeaders *headers_local;
  undefined8 uStack_28;
  HttpMethod method_local;
  PartialResponseService *this_local;
  StringPtr url_local;
  
  uStack_28 = CONCAT44(in_register_00000034,method);
  this_local = (PartialResponseService *)url.content.size_;
  headers_local._4_4_ = url.content.ptr._0_4_;
  local_40.response = (Response *)requestBody;
  url_local.content.ptr = (char *)headers;
  url_local.content.size_ = (size_t)this;
  MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
  AsyncInputStream::readAllBytes((AsyncInputStream *)&local_40,(uint64_t)response);
  Promise<kj::Array<unsigned_char>>::
  then<kj::(anonymous_namespace)::PartialResponseService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda(kj::Array<unsigned_char>&&)_1_>
            ((Promise<kj::Array<unsigned_char>> *)this,&local_40);
  Promise<kj::Array<unsigned_char>_>::~Promise((Promise<kj::Array<unsigned_char>_> *)&local_40);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    return requestBody.readAllBytes()
        .then([this,&response](kj::Array<byte>&&) -> kj::Promise<void> {
      HttpHeaders headers(table);
      auto body = response.send(200, "OK", headers, 32);
      auto promise = body->write("foo"_kjb);
      return promise.attach(kj::mv(body)).then([]() -> kj::Promise<void> {
        return KJ_EXCEPTION(FAILED, "failed");
      });
    });
  }